

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

bool __thiscall
MemoryManager::setInt(MemoryManager *this,uint32_t addr,uint32_t val,uint32_t *cycles)

{
  bool bVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  uint in_ESI;
  undefined8 in_RDI;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = isAddrExist((MemoryManager *)CONCAT44(in_ESI,in_EDX),(uint32_t)((ulong)in_RCX >> 0x20));
  if (bVar1) {
    setByte((MemoryManager *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
            (uint32_t)((ulong)in_RDI >> 0x20),(uint8_t)((ulong)in_RDI >> 0x18),
            (uint32_t *)CONCAT44(in_ESI,in_EDX));
    setByte((MemoryManager *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
            (uint32_t)((ulong)in_RDI >> 0x20),(uint8_t)((ulong)in_RDI >> 0x18),
            (uint32_t *)CONCAT44(in_ESI,in_EDX));
    setByte((MemoryManager *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
            (uint32_t)((ulong)in_RDI >> 0x20),(uint8_t)((ulong)in_RDI >> 0x18),
            (uint32_t *)CONCAT44(in_ESI,in_EDX));
    setByte((MemoryManager *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
            (uint32_t)((ulong)in_RDI >> 0x20),(uint8_t)((ulong)in_RDI >> 0x18),
            (uint32_t *)CONCAT44(in_ESI,in_EDX));
  }
  else {
    dbgprintf("Int write to invalid addr 0x%x!\n",(ulong)in_ESI);
  }
  return bVar1;
}

Assistant:

bool MemoryManager::setInt(uint32_t addr, uint32_t val, uint32_t *cycles) {
  if (!this->isAddrExist(addr)) {
    dbgprintf("Int write to invalid addr 0x%x!\n", addr);
    return false;
  }
  this->setByte(addr, val & 0xFF, cycles);
  this->setByte(addr + 1, (val >> 8) & 0xFF);
  this->setByte(addr + 2, (val >> 16) & 0xFF);
  this->setByte(addr + 3, (val >> 24) & 0xFF);
  return true;
}